

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O3

void __thiscall
chrono::collision::ChCollisionSystemBullet::GetBoundingBox
          (ChCollisionSystemBullet *this,ChVector<double> *aabb_min,ChVector<double> *aabb_max)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  cbtVector3 aabbMax;
  cbtVector3 aabbMin;
  ulong local_40;
  float local_38;
  ulong local_30;
  float local_28;
  
  (*this->bt_broadphase->_vptr_cbtBroadphaseInterface[0xb])(this->bt_broadphase,&local_30,&local_40)
  ;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_30;
  auVar1 = vcvtps2pd_avx(auVar1);
  *(undefined1 (*) [16])aabb_min->m_data = auVar1;
  aabb_min->m_data[2] = (double)local_28;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_40;
  auVar1 = vcvtps2pd_avx(auVar2);
  *(undefined1 (*) [16])aabb_max->m_data = auVar1;
  aabb_max->m_data[2] = (double)local_38;
  return;
}

Assistant:

void ChCollisionSystemBullet::GetBoundingBox(ChVector<>& aabb_min, ChVector<>& aabb_max) const {
    cbtVector3 aabbMin;
    cbtVector3 aabbMax;
    bt_broadphase->getBroadphaseAabb(aabbMin, aabbMax);
    aabb_min = ChVector<>((double)aabbMin.x(), (double)aabbMin.y(), (double)aabbMin.z());
    aabb_max = ChVector<>((double)aabbMax.x(), (double)aabbMax.y(), (double)aabbMax.z());
}